

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

LibraryPtr __thiscall Jinx::Impl::Runtime::GetLibrary(Runtime *this,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  iterator iVar2;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  LibraryPtr LVar3;
  shared_ptr<Jinx::Impl::Library> library;
  undefined1 local_69;
  shared_ptr<Jinx::Impl::Library> local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
  local_58;
  
  std::mutex::lock((mutex *)&name[0x81].field_2);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
                  *)(name[0x82].field_2._M_local_buf + 8),in_RDX);
  if (iVar2._M_node == (_Base_ptr)&name[0x83]._M_string_length) {
    std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Jinx::Impl::Runtime,void>
              ((__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> *)
               &name->_M_string_length);
    std::__shared_ptr<Jinx::Impl::Library,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Jinx::Allocator<Jinx::Impl::Library>,std::shared_ptr<Jinx::Impl::Runtime>,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const&>
              ((__shared_ptr<Jinx::Impl::Library,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               (Allocator<Jinx::Impl::Library> *)&local_69,
               (shared_ptr<Jinx::Impl::Runtime> *)&local_58,in_RDX);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.first._M_string_length);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
    ::pair<std::shared_ptr<Jinx::Impl::Library>_&,_true>(&local_58,in_RDX,&local_68);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,4096ul,16ul>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::shared_ptr<Jinx::Impl::Library>>>
              ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,4096ul,16ul>>
                *)(name[0x82].field_2._M_local_buf + 8),&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
    ::~pair(&local_58);
    _Var1._M_pi = local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_IRuntime)._vptr_IRuntime =
         (_func_int **)
         local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    std::__shared_ptr<Jinx::ILibrary,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Jinx::Impl::Library,void>
              ((__shared_ptr<Jinx::ILibrary,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> *)(iVar2._M_node + 2))
    ;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&name[0x81].field_2);
  LVar3.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar3.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (LibraryPtr)LVar3.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t LibraryPtr Runtime::GetLibrary(const String & name)
	{
		std::lock_guard<std::mutex> lock(m_libraryMutex);
		auto itr = m_libraryMap.find(name);
		if (itr == m_libraryMap.end())
		{
			auto library = std::allocate_shared<Library>(Allocator<Library>(), shared_from_this(), name);
			m_libraryMap.insert(std::make_pair(name, library));
			return library;
		}
		return itr->second;
	}